

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::SliderScalarN
               (char *label,ImGuiDataType data_type,void *v,int components,void *v_min,void *v_max,
               char *format,float power)

{
  ImGuiWindow *pIVar1;
  size_t sVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  char *text_end;
  int int_id;
  bool bVar5;
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  int_id = 0;
  bVar5 = false;
  if (pIVar1->SkipItems == false) {
    BeginGroup();
    PushID(label);
    PushMultiItemsWidths(components,0.0);
    sVar2 = GDataTypeInfo[data_type].Size;
    if (components < 1) {
      components = 0;
    }
    bVar5 = false;
    for (; components != int_id; int_id = int_id + 1) {
      PushID(int_id);
      bVar4 = SliderScalar("##v",data_type,v,v_min,v_max,format,power);
      bVar5 = (bool)(bVar5 | bVar4);
      SameLine(0.0,(pIVar3->Style).ItemInnerSpacing.x);
      PopID();
      PopItemWidth();
      v = (void *)((long)v + sVar2);
    }
    PopID();
    text_end = FindRenderedTextEnd(label,(char *)0x0);
    TextUnformatted(label,text_end);
    EndGroup();
  }
  return bVar5;
}

Assistant:

bool ImGui::SliderScalarN(const char* label, ImGuiDataType data_type, void* v, int components, const void* v_min, const void* v_max, const char* format, float power)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    bool value_changed = false;
    BeginGroup();
    PushID(label);
    PushMultiItemsWidths(components);
    size_t type_size = GDataTypeInfo[data_type].Size;
    for (int i = 0; i < components; i++)
    {
        PushID(i);
        value_changed |= SliderScalar("##v", data_type, v, v_min, v_max, format, power);
        SameLine(0, g.Style.ItemInnerSpacing.x);
        PopID();
        PopItemWidth();
        v = (void*)((char*)v + type_size);
    }
    PopID();

    TextUnformatted(label, FindRenderedTextEnd(label));
    EndGroup();
    return value_changed;
}